

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O3

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs,RK_S32 idc)

{
  MppBuffer buffer;
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  bool bVar30;
  ulong uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [11];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [13];
  undefined1 auVar41 [11];
  undefined1 auVar42 [13];
  undefined1 auVar43 [11];
  bool bVar44;
  long lVar45;
  RK_S32 (*paRVar46) [2];
  long lVar47;
  ulong uVar48;
  char *pcVar49;
  undefined4 uVar53;
  undefined1 auVar50 [12];
  undefined4 uVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  uint uVar57;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  undefined1 auVar58 [16];
  short sVar62;
  uint uVar63;
  int iVar64;
  uint uVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  RK_U8 table [48256];
  char local_bcb8 [48264];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined6 uVar65;
  
  pcVar49 = local_bcb8;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_set_cabac_idc");
  }
  if ((-1 < idc) && (bufs->cabac_table == (MppBuffer)0x0)) {
    mpp_buffer_get_with_tag
              (bufs->group,&bufs->cabac_table,0xbc80,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_set_cabac_idc");
  }
  buffer = bufs->cabac_table;
  if (((buffer != (MppBuffer)0x0) && (-1 < idc)) && (bufs->cabac_init_idc != idc)) {
    uVar48 = 0;
    memset(local_bcb8,0,0xbc80);
    auVar52._8_4_ = 0xffffffff;
    auVar52._0_8_ = 0xffffffffffffffff;
    auVar52._12_4_ = 0xffffffff;
    do {
      lVar45 = 0;
      bVar44 = true;
      do {
        bVar30 = bVar44;
        paRVar46 = h264_context_init[(uint)idc];
        if (bVar30) {
          paRVar46 = h264_context_init_intra;
        }
        lVar47 = 0;
        do {
          auVar58 = *(undefined1 (*) [16])(*(RK_S32 (*) [460] [2])paRVar46 + lVar47);
          auVar51 = *(undefined1 (*) [16])(*(RK_S32 (*) [460] [2])paRVar46 + lVar47 + 2);
          uVar57 = ((int)((auVar58._0_8_ & 0xffffffff) * (uVar48 & 0xffffffff)) >> 4) +
                   auVar58._4_4_;
          uVar59 = ((int)((auVar58._8_8_ & 0xffffffff) * (uVar48 & 0xffffffff)) >> 4) +
                   auVar58._12_4_;
          uVar60 = ((int)((auVar51._0_8_ & 0xffffffff) * (uVar48 & 0xffffffff)) >> 4) +
                   auVar51._4_4_;
          uVar61 = ((int)((auVar51._8_8_ & 0xffffffff) * (uVar48 & 0xffffffff)) >> 4) +
                   auVar51._12_4_;
          uVar63 = ~-(uint)((int)uVar57 < 0x7e) & 0x7e | uVar57 & -(uint)((int)uVar57 < 0x7e);
          uVar66 = ~-(uint)((int)uVar59 < 0x7e) & 0x7e | uVar59 & -(uint)((int)uVar59 < 0x7e);
          uVar68 = ~-(uint)((int)uVar60 < 0x7e) & 0x7e | uVar60 & -(uint)((int)uVar60 < 0x7e);
          uVar70 = ~-(uint)((int)uVar61 < 0x7e) & 0x7e | uVar61 & -(uint)((int)uVar61 < 0x7e);
          uVar72 = -(uint)(1 < (int)uVar63);
          uVar73 = -(uint)(1 < (int)uVar66);
          uVar74 = -(uint)(1 < (int)uVar68);
          uVar75 = -(uint)(1 < (int)uVar70);
          iVar64 = (uVar63 & uVar72) + uVar72 + 1;
          iVar67 = (uVar66 & uVar73) + uVar73 + 1;
          iVar69 = (uVar68 & uVar74) + uVar74 + 1;
          iVar71 = (uVar70 & uVar75) + uVar75 + 1;
          auVar58._0_4_ = -(uint)(0x3f < (int)uVar57);
          auVar58._4_4_ = -(uint)(0x3f < (int)uVar59);
          auVar58._8_4_ = -(uint)(0x3f < (int)uVar60);
          auVar58._12_4_ = -(uint)(0x3f < (int)uVar61);
          auVar58 = packssdw(auVar58,auVar58);
          auVar58 = packsswb(auVar58 ^ auVar52,auVar58 ^ auVar52);
          sVar5 = (short)iVar64;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar64 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar64 >> 0x10);
          sVar62 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar64 >> 0x10) -
                            (0xff < sVar5),cVar1);
          sVar5 = (short)iVar67;
          cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar67 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar67 >> 0x10);
          uVar53 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar67 >> 0x10) -
                            (0xff < sVar5),CONCAT12(cVar2,sVar62));
          sVar5 = (short)iVar69;
          cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar69 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar69 >> 0x10);
          uVar65 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar69 >> 0x10) -
                            (0xff < sVar5),CONCAT14(cVar3,uVar53));
          sVar5 = (short)iVar71;
          cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar71 - (0xff < sVar5);
          sVar10 = (short)((uint)iVar71 >> 0x10);
          sVar5 = (short)((uint)uVar53 >> 0x10);
          sVar6 = (short)((uint6)uVar65 >> 0x20);
          sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * (char)((uint)iVar71 >> 0x10) -
                                    (0xff < sVar10),CONCAT16(cVar4,uVar65)) >> 0x30);
          cVar1 = ((0 < sVar62) * (sVar62 < 0x100) * cVar1 - (0xff < sVar62)) * '\x02';
          cVar2 = ((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5)) * '\x02';
          cVar3 = ((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6)) * '\x02';
          cVar4 = ((0 < sVar10) * (sVar10 < 0x100) * cVar4 - (0xff < sVar10)) * '\x02';
          *(uint *)(pcVar49 + lVar47 + lVar45) =
               ~auVar58._0_4_ &
               CONCAT13(cVar4 + -0x7f,CONCAT12(cVar3 + -0x7f,CONCAT11(cVar2 + -0x7f,cVar1 + -0x7f)))
               | (CONCAT13(cVar4,CONCAT12(cVar3,CONCAT11(cVar2,cVar1))) ^ 0x7e7e7e7e) &
                 auVar58._0_4_;
          lVar47 = lVar47 + 4;
        } while (lVar47 != 0x1cc);
        lVar45 = 0x1d0;
        bVar44 = false;
      } while (bVar30);
      uVar48 = uVar48 + 1;
      pcVar49 = pcVar49 + 0x3a0;
    } while (uVar48 != 0x34);
    lVar45 = 0;
    do {
      auVar52 = *(undefined1 (*) [16])(local_bcb8 + lVar45 * 8);
      uVar53 = auVar52._8_4_;
      uVar54 = auVar52._12_4_;
      uVar48 = CONCAT44(uVar53,uVar53);
      auVar55._8_4_ = 0;
      auVar55._0_8_ = uVar48;
      auVar55 = auVar55 << 0x20;
      auVar40._8_4_ = uVar54;
      auVar40._0_8_ = uVar48;
      auVar40[0xc] = 0;
      uVar31 = CONCAT44(uVar53,uVar54);
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar31;
      auVar50 = auVar50 << 0x20;
      auVar42._8_4_ = uVar54;
      auVar42._0_8_ = uVar31;
      auVar42[0xc] = 0;
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar40 << 0x20;
      auVar20[0xe] = auVar52[0xb];
      auVar41[8] = auVar52[10];
      auVar41._0_8_ = uVar48;
      auVar41._9_2_ = auVar20._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar55._0_11_;
      auVar22._12_3_ = auVar41._8_3_;
      auVar24[10] = auVar52[9];
      auVar24._0_10_ = auVar55._0_10_;
      auVar24._11_4_ = auVar22._11_4_;
      auVar26[9] = 0;
      auVar26._0_9_ = auVar55._0_9_;
      auVar26._10_5_ = auVar24._10_5_;
      auVar34[4] = auVar52[8];
      auVar34._0_4_ = uVar53;
      auVar34._5_6_ = auVar26._9_6_;
      auVar32._7_8_ = 0;
      auVar32._0_7_ = auVar34._4_7_;
      auVar35._1_8_ = SUB158(auVar32 << 0x40,7);
      auVar35[0] = auVar52[3];
      auVar35._9_6_ = 0;
      auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar36[0] = auVar52[2];
      auVar36._11_4_ = 0;
      auVar28[2] = auVar52[1];
      auVar28._0_2_ = auVar52._0_2_;
      auVar28._3_12_ = SUB1512(auVar36 << 0x20,3);
      auVar56._0_2_ = auVar52._0_2_ & 0xff;
      auVar56._2_13_ = auVar28._2_13_;
      auVar56[0xf] = 0;
      auVar58 = pshuflw(auVar56,auVar56,0x1b);
      auVar58 = pshufhw(auVar58,auVar58,0x1b);
      auVar21[0xd] = 0;
      auVar21._0_13_ = auVar42 << 0x20;
      auVar21[0xe] = auVar52[0xf];
      auVar43[8] = auVar52[0xe];
      auVar43._0_8_ = uVar31;
      auVar43._9_2_ = auVar21._13_2_;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar50._0_11_;
      auVar23._12_3_ = auVar43._8_3_;
      auVar25[10] = auVar52[0xd];
      auVar25._0_10_ = auVar50._0_10_;
      auVar25._11_4_ = auVar23._11_4_;
      auVar27[9] = 0;
      auVar27._0_9_ = auVar50._0_9_;
      auVar27._10_5_ = auVar25._10_5_;
      auVar37[4] = auVar52[0xc];
      auVar37._0_4_ = uVar54;
      auVar37._5_6_ = auVar27._9_6_;
      auVar33._7_8_ = 0;
      auVar33._0_7_ = auVar37._4_7_;
      auVar38._1_8_ = SUB158(auVar33 << 0x40,7);
      auVar38[0] = auVar52[7];
      auVar38._9_6_ = 0;
      auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
      auVar39[0] = auVar52[6];
      auVar39._11_4_ = 0;
      auVar29[2] = auVar52[5];
      auVar29._0_2_ = auVar52._4_2_;
      auVar29._3_12_ = SUB1512(auVar39 << 0x20,3);
      auVar51._0_2_ = auVar52._4_2_ & 0xff;
      auVar51._2_13_ = auVar29._2_13_;
      auVar51[0xf] = 0;
      auVar52 = pshuflw(auVar51,auVar51,0x1b);
      auVar52 = pshufhw(auVar52,auVar52,0x1b);
      sVar5 = auVar52._0_2_;
      sVar6 = auVar52._2_2_;
      sVar10 = auVar52._4_2_;
      sVar62 = auVar52._6_2_;
      sVar7 = auVar52._8_2_;
      sVar8 = auVar52._10_2_;
      sVar9 = auVar52._12_2_;
      sVar11 = auVar52._14_2_;
      sVar12 = auVar58._0_2_;
      sVar13 = auVar58._2_2_;
      sVar14 = auVar58._4_2_;
      sVar15 = auVar58._6_2_;
      sVar16 = auVar58._8_2_;
      sVar17 = auVar58._10_2_;
      sVar18 = auVar58._12_2_;
      sVar19 = auVar58._14_2_;
      lVar47 = lVar45 * 8;
      local_bcb8[lVar47] = (0 < sVar5) * (sVar5 < 0x100) * auVar52[0] - (0xff < sVar5);
      local_bcb8[lVar47 + 1] = (0 < sVar6) * (sVar6 < 0x100) * auVar52[2] - (0xff < sVar6);
      local_bcb8[lVar47 + 2] = (0 < sVar10) * (sVar10 < 0x100) * auVar52[4] - (0xff < sVar10);
      local_bcb8[lVar47 + 3] = (0 < sVar62) * (sVar62 < 0x100) * auVar52[6] - (0xff < sVar62);
      local_bcb8[lVar47 + 0xc] = (0 < sVar12) * (sVar12 < 0x100) * auVar58[0] - (0xff < sVar12);
      local_bcb8[lVar47 + 0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar58[2] - (0xff < sVar13);
      local_bcb8[lVar47 + 0xe] = (0 < sVar14) * (sVar14 < 0x100) * auVar58[4] - (0xff < sVar14);
      local_bcb8[lVar47 + 0xf] = (0 < sVar15) * (sVar15 < 0x100) * auVar58[6] - (0xff < sVar15);
      local_bcb8[lVar47 + 0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar52[8] - (0xff < sVar7);
      local_bcb8[lVar47 + 0xd] = (0 < sVar8) * (sVar8 < 0x100) * auVar52[10] - (0xff < sVar8);
      local_bcb8[lVar47 + 0xe] = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0xc] - (0xff < sVar9);
      local_bcb8[lVar47 + 0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar52[0xe] - (0xff < sVar11);
      local_bcb8[lVar47 + 0x18] = (0 < sVar16) * (sVar16 < 0x100) * auVar58[8] - (0xff < sVar16);
      local_bcb8[lVar47 + 0x19] = (0 < sVar17) * (sVar17 < 0x100) * auVar58[10] - (0xff < sVar17);
      local_bcb8[lVar47 + 0x1a] = (0 < sVar18) * (sVar18 < 0x100) * auVar58[0xc] - (0xff < sVar18);
      local_bcb8[lVar47 + 0x1b] = (0 < sVar19) * (sVar19 < 0x100) * auVar58[0xe] - (0xff < sVar19);
      lVar45 = lVar45 + 2;
    } while (lVar45 != 0x1790);
    mpp_buffer_write_with_caller(buffer,0,local_bcb8,0xbc80,"vepu_write_cabac_table");
  }
  bufs->cabac_init_idc = idc;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_set_cabac_idc",bufs);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs, RK_S32 idc)
{
    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (idc >= 0 && !bufs->cabac_table)
        mpp_buffer_get(bufs->group, &bufs->cabac_table, H264E_CABAC_TABLE_BUF_SIZE);

    if (bufs->cabac_table && idc != bufs->cabac_init_idc && idc >= 0)
        vepu_write_cabac_table(bufs->cabac_table, idc);

    bufs->cabac_init_idc = idc;

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return MPP_OK;
}